

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmAddLinkLibraryForTarget(void *arg,char *tgt,char *value,int libtype)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (libtype == 2) {
    std::__cxx11::string::string((string *)&local_30,tgt,&local_51);
    std::__cxx11::string::string((string *)&local_50,value,&local_52);
    cmMakefile::AddLinkLibraryForTarget((cmMakefile *)arg,&local_30,&local_50,OPTIMIZED);
  }
  else if (libtype == 1) {
    std::__cxx11::string::string((string *)&local_30,tgt,&local_51);
    std::__cxx11::string::string((string *)&local_50,value,&local_52);
    cmMakefile::AddLinkLibraryForTarget((cmMakefile *)arg,&local_30,&local_50,DEBUG);
  }
  else {
    if (libtype != 0) {
      return;
    }
    std::__cxx11::string::string((string *)&local_30,tgt,&local_51);
    std::__cxx11::string::string((string *)&local_50,value,&local_52);
    cmMakefile::AddLinkLibraryForTarget((cmMakefile *)arg,&local_30,&local_50,GENERAL);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CCONV cmAddLinkLibraryForTarget(void *arg, const char *tgt,
  const char*value, int libtype)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);

  switch (libtype)
    {
    case CM_LIBRARY_GENERAL:
      mf->AddLinkLibraryForTarget(tgt,value, cmTarget::GENERAL);
      break;
    case CM_LIBRARY_DEBUG:
      mf->AddLinkLibraryForTarget(tgt,value, cmTarget::DEBUG);
      break;
    case CM_LIBRARY_OPTIMIZED:
      mf->AddLinkLibraryForTarget(tgt,value, cmTarget::OPTIMIZED);
      break;
    }
}